

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMaxDown
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *dispatcher,
          bool updateOverlaps)

{
  Edge EVar1;
  Edge *pEVar2;
  bool bVar3;
  uint uVar4;
  Handle *pHVar5;
  Handle *pHVar6;
  Handle *pHandleA;
  Handle *pHandleB;
  undefined8 in_RCX;
  uint in_EDX;
  int in_ESI;
  btAxisSweep3Internal<unsigned_int> *in_RDI;
  byte in_R8B;
  Edge swap;
  int axis2;
  int axis1;
  Handle *handle1;
  Handle *handle0;
  Handle *pHandlePrev;
  Handle *pHandleEdge;
  Edge *pPrev;
  Edge *pEdge;
  Edge *local_30;
  Edge *local_28;
  
  local_28 = in_RDI->m_pEdges[in_ESI] + in_EDX;
  pHVar5 = getHandle(in_RDI,local_28->m_handle);
  pEVar2 = local_28;
  for (; local_30 = pEVar2 + -1, local_28->m_pos < local_30->m_pos; local_28 = local_28 + -1) {
    pHVar6 = getHandle(in_RDI,pEVar2[-1].m_handle);
    uVar4 = Edge::IsMax(local_30);
    if (uVar4 == 0) {
      pHandleA = getHandle(in_RDI,local_28->m_handle);
      pHandleB = getHandle(in_RDI,pEVar2[-1].m_handle);
      uVar4 = 1 << ((byte)in_ESI & 0x1f) & 3;
      if ((((in_R8B & 1) != 0) &&
          (bVar3 = testOverlap2D(in_RDI,pHandleA,pHandleB,uVar4,1 << (sbyte)uVar4 & 3), bVar3)) &&
         ((*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [3])(in_RDI->m_pairCache,pHandleA,pHandleB,in_RCX),
         in_RDI->m_userPairCallback != (btOverlappingPairCallback *)0x0)) {
        (*in_RDI->m_userPairCallback->_vptr_btOverlappingPairCallback[3])
                  (in_RDI->m_userPairCallback,pHandleA,pHandleB,in_RCX);
      }
      *(int *)((long)(&(pHVar6->super_btBroadphaseProxy).m_aabbMax + 1) + (long)in_ESI * 4) =
           *(int *)((long)(&(pHVar6->super_btBroadphaseProxy).m_aabbMax + 1) + (long)in_ESI * 4) + 1
      ;
    }
    else {
      pHVar6->m_maxEdges[in_ESI] = pHVar6->m_maxEdges[in_ESI] + 1;
    }
    pHVar5->m_maxEdges[in_ESI] = pHVar5->m_maxEdges[in_ESI] - 1;
    EVar1 = *local_28;
    *local_28 = *local_30;
    *local_30 = EVar1;
    pEVar2 = local_30;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;

			if (updateOverlaps  
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				
				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
			


			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}